

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

bool __thiscall ON_ObjRef_IRefID::Read(ON_ObjRef_IRefID *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int minor_version;
  int major_version;
  int local_1cc;
  ulong local_1c8;
  uchar auStack_1c0 [8];
  double local_1b8 [16];
  ON_UUID local_138;
  undefined4 local_128;
  double local_120 [16];
  ON_COMPONENT_INDEX local_a0;
  ON_ObjRefEvaluationParameter local_98;
  
  local_1c8._0_4_ = 0;
  local_1c8._4_2_ = 0;
  local_1c8._6_2_ = 0;
  auStack_1c0[0] = '\0';
  auStack_1c0[1] = '\0';
  auStack_1c0[2] = '\0';
  auStack_1c0[3] = '\0';
  auStack_1c0[4] = '\0';
  auStack_1c0[5] = '\0';
  auStack_1c0[6] = '\0';
  auStack_1c0[7] = '\0';
  pdVar4 = (double *)&ON_Xform::ZeroTransformation;
  pdVar5 = local_1b8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  local_138.Data1 = 0;
  local_138.Data2 = 0;
  local_138.Data3 = 0;
  local_138.Data4[0] = '\0';
  local_138.Data4[1] = '\0';
  local_138.Data4[2] = '\0';
  local_138.Data4[3] = '\0';
  local_138.Data4[4] = '\0';
  local_138.Data4[5] = '\0';
  local_138.Data4[6] = '\0';
  local_138.Data4[7] = '\0';
  bVar2 = false;
  local_128 = 0;
  pdVar4 = (double *)&ON_Xform::ZeroTransformation;
  pdVar5 = local_120;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  ON_COMPONENT_INDEX::ON_COMPONENT_INDEX(&local_a0);
  ON_ObjRefEvaluationParameter::ON_ObjRefEvaluationParameter(&local_98);
  memcpy(this,&local_1c8,400);
  ON_ObjRefEvaluationParameter::~ON_ObjRefEvaluationParameter(&local_98);
  local_1c8 = local_1c8 & 0xffffffff00000000;
  local_1cc = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,(int *)&local_1c8,&local_1cc);
  if (bVar1) {
    bVar1 = (int)local_1c8 == 1;
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_iref_uuid), bVar1)) &&
        (bVar1 = ON_BinaryArchive::ReadXform(archive,&this->m_iref_xform), bVar1)) &&
       (((bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_idef_uuid), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_idef_geometry_index), bVar1)) &&
        ((0 < local_1cc &&
         (bVar1 = ON_BinaryArchive::ReadComponentIndex(archive,&this->m_component_index), bVar1)))))
       ) {
      bVar1 = ON_ObjRefEvaluationParameter::Read(&this->m_evp,archive);
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_ObjRef_IRefID::Read( ON_BinaryArchive& archive )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( 
                          TCODE_ANONYMOUS_CHUNK, 
                          &major_version, 
                          &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadUuid(m_iref_uuid);
    if (!rc) break;

    rc = archive.ReadXform(m_iref_xform);
    if (!rc) break;

    rc = archive.ReadUuid(m_idef_uuid);
    if (!rc) break;

    rc = archive.ReadInt(&m_idef_geometry_index);
    if (!rc) break;

    if ( minor_version >= 1 )
    {
      // 13 July 2006 - 1.1 - added m_component_index and m_evp
      rc = archive.ReadComponentIndex(m_component_index);
      if (!rc) break;

      rc = m_evp.Read(archive);
      if (!rc) break;
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}